

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void variance128_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                     __m128i *sum)

{
  uint8_t *ref_00;
  undefined4 in_register_00000084;
  long lVar1;
  uint8_t *src_00;
  int i;
  int iVar2;
  bool bVar3;
  
  (*sse)[0] = 0;
  (*sse)[1] = 0;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    lVar1 = 4;
    ref_00 = ref;
    src_00 = src;
    while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
      variance16_kernel_sse2(src_00,ref_00,(__m128i *)CONCAT44(in_register_00000084,h),sse);
      variance16_kernel_sse2
                (src_00 + 0x10,ref_00 + 0x10,(__m128i *)CONCAT44(in_register_00000084,h),sse);
      ref_00 = ref_00 + 0x20;
      src_00 = src_00 + 0x20;
    }
    src = src + src_stride;
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

static inline void variance128_sse2(const uint8_t *src, const int src_stride,
                                    const uint8_t *ref, const int ref_stride,
                                    const int h, __m128i *const sse,
                                    __m128i *const sum) {
  assert(h <= 8);  // May overflow for larger height.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < 4; ++j) {
      const int offset0 = j << 5;
      const int offset1 = offset0 + 16;
      variance16_kernel_sse2(src + offset0, ref + offset0, sse, sum);
      variance16_kernel_sse2(src + offset1, ref + offset1, sse, sum);
    }
    src += src_stride;
    ref += ref_stride;
  }
}